

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layoutengine.cpp
# Opt level: O0

QSize QtMWidgets::qSmartMinSize(QWidget *w)

{
  QSize QVar1;
  anon_union_4_2_313b0b05_for_QSizePolicy_1 local_3c;
  QSize local_38;
  QSize local_30;
  QSize local_28;
  QSize local_20;
  QWidget *local_18;
  QWidget *w_local;
  
  local_18 = w;
  local_20 = (QSize)(**(code **)(*(long *)w + 0x70))();
  local_28 = (QSize)(**(code **)(*(long *)local_18 + 0x78))();
  local_30 = (QSize)QWidget::minimumSize();
  local_38 = (QSize)QWidget::maximumSize();
  local_3c.data = QWidget::sizePolicy();
  QVar1 = qSmartMinSize(&local_20,&local_28,&local_30,&local_38,(QSizePolicy *)&local_3c.bits);
  return QVar1;
}

Assistant:

QSize qSmartMinSize( const QWidget * w )
{
	return qSmartMinSize( w->sizeHint(), w->minimumSizeHint(),
		w->minimumSize(), w->maximumSize(),
		w->sizePolicy() );
}